

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# str-util.cc
# Opt level: O0

bool tinyusdz::is_valid_utf8(string *str)

{
  uint32_t uVar1;
  ulong uVar2;
  uchar *puVar3;
  ulong uStack_20;
  uint32_t len;
  size_t i;
  string *str_local;
  
  uStack_20 = 0;
  while( true ) {
    uVar2 = ::std::__cxx11::string::size();
    if (uVar2 <= uStack_20) {
      return true;
    }
    puVar3 = (uchar *)::std::__cxx11::string::operator[]((ulong)str);
    uVar1 = detail::utf8_len(*puVar3);
    if (uVar1 == 0) break;
    uStack_20 = uVar1 + uStack_20;
  }
  return false;
}

Assistant:

bool is_valid_utf8(const std::string &str) {
  // TODO: Consider UTF-BOM?
  for (size_t i = 0; i < str.size();) {
    uint32_t len = detail::utf8_len(*reinterpret_cast<const unsigned char *>(&str[i]));
    if (len == 0) {
      return false;
    }
    i += len;
  }
  return true;
}